

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O0

void __thiscall
QtPrivate::QPodArrayOps<Qt::DayOfWeek>::insert
          (QPodArrayOps<Qt::DayOfWeek> *this,qsizetype i,qsizetype n,parameter_type t)

{
  DayOfWeek *pDVar1;
  DayOfWeek in_ECX;
  long in_RDX;
  QArrayDataPointer<Qt::DayOfWeek> *in_RSI;
  long in_RDI;
  DayOfWeek *where;
  GrowthPosition pos;
  DayOfWeek copy;
  QArrayDataPointer<Qt::DayOfWeek> *in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd8;
  undefined4 uVar2;
  DayOfWeek DVar3;
  
  uVar2 = 0;
  if ((*(long *)(in_RDI + 0x10) != 0) && (in_RSI == (QArrayDataPointer<Qt::DayOfWeek> *)0x0)) {
    uVar2 = 1;
  }
  DVar3 = in_ECX;
  QArrayDataPointer<Qt::DayOfWeek>::detachAndGrow
            (in_RSI,(GrowthPosition)((ulong)in_RDX >> 0x20),CONCAT44(in_ECX,in_ECX),
             (DayOfWeek **)CONCAT44(uVar2,in_stack_ffffffffffffffd8),in_stack_ffffffffffffffd0);
  pDVar1 = createHole((QPodArrayOps<Qt::DayOfWeek> *)in_RSI,(GrowthPosition)((ulong)in_RDX >> 0x20),
                      CONCAT44(DVar3,in_ECX),CONCAT44(uVar2,in_stack_ffffffffffffffd8));
  while (in_RDX != 0) {
    *pDVar1 = in_ECX;
    pDVar1 = pDVar1 + 1;
    in_RDX = in_RDX + -1;
  }
  return;
}

Assistant:

void insert(qsizetype i, qsizetype n, parameter_type t)
    {
        T copy(t);

        typename Data::GrowthPosition pos = Data::GrowsAtEnd;
        if (this->size != 0 && i == 0)
            pos = Data::GrowsAtBeginning;

        this->detachAndGrow(pos, n, nullptr, nullptr);
        Q_ASSERT((pos == Data::GrowsAtBeginning && this->freeSpaceAtBegin() >= n) ||
                 (pos == Data::GrowsAtEnd && this->freeSpaceAtEnd() >= n));

        T *where = createHole(pos, i, n);
        while (n--)
            *where++ = copy;
    }